

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O0

void __thiscall tf::Executor::_schedule(Executor *this,SmallVector<tf::Node_*,_2U> *nodes)

{
  uint uVar1;
  mutex_type *n;
  const_reference ppNVar2;
  atomic<int> *paVar3;
  bool bVar4;
  uint uStack_94;
  mutex_type *local_50;
  size_t k;
  lock_guard<std::mutex> lock;
  size_t i;
  size_type num_nodes;
  SmallVector<tf::Node_*,_2U> *nodes_local;
  Executor *this_local;
  
  n = (mutex_type *)
      SmallVectorTemplateCommon<tf::Node_*,_void>::size
                ((SmallVectorTemplateCommon<tf::Node_*,_void> *)nodes);
  if (n != (mutex_type *)0x0) {
    for (lock._M_device = (mutex_type *)0x0; lock._M_device < n;
        lock._M_device = (mutex_type *)((long)&((lock._M_device)->super___mutex_base)._M_mutex + 1))
    {
      ppNVar2 = SmallVectorTemplateCommon<tf::Node_*,_void>::operator[]
                          ((SmallVectorTemplateCommon<tf::Node_*,_void> *)nodes,
                           (size_type)lock._M_device);
      paVar3 = &(*ppNVar2)->_state;
      uStack_94 = (paVar3->super___atomic_base<int>)._M_i;
      do {
        LOCK();
        uVar1 = (paVar3->super___atomic_base<int>)._M_i;
        bVar4 = uStack_94 == uVar1;
        if (bVar4) {
          (paVar3->super___atomic_base<int>)._M_i = uStack_94 | 8;
          uVar1 = uStack_94;
        }
        UNLOCK();
        uStack_94 = uVar1;
      } while (!bVar4);
    }
    std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&k,&this->_wsq_mutex);
    for (local_50 = (mutex_type *)0x0; local_50 < n;
        local_50 = (mutex_type *)((long)&(local_50->super___mutex_base)._M_mutex + 1)) {
      ppNVar2 = SmallVectorTemplateCommon<tf::Node_*,_void>::operator[]
                          ((SmallVectorTemplateCommon<tf::Node_*,_void> *)nodes,(size_type)local_50)
      ;
      TaskQueue<tf::Node_*>::push(&this->_wsq,*ppNVar2);
    }
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&k);
    Notifier::notify_n(&this->_notifier,(size_t)n);
  }
  return;
}

Assistant:

inline void Executor::_schedule(const SmallVector<Node*>& nodes) {

  // parent topology may be removed!
  const auto num_nodes = nodes.size();

  if(num_nodes == 0) {
    return;
  }

  // make the node ready
  for(size_t i=0; i<num_nodes; ++i) {
    nodes[i]->_state.fetch_or(Node::READY, std::memory_order_release);
  }

  {
    std::lock_guard<std::mutex> lock(_wsq_mutex);
    for(size_t k=0; k<num_nodes; ++k) {
      _wsq.push(nodes[k]);
    }
  }

  _notifier.notify_n(num_nodes);
}